

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall SQVM::Init(SQVM *this,SQVM *friendvm,SQInteger stacksize)

{
  SQTable *x;
  CallInfo local_68;
  
  local_68._ip = (SQInstruction *)CONCAT44(local_68._ip._4_4_,0x1000001);
  local_68._literals = (SQObjectPtr *)0x0;
  sqvector<SQObjectPtr>::resize(&this->_stack,stacksize,(SQObjectPtr *)&local_68);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_68);
  this->_alloccallsstacksize = 4;
  local_68._closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_68._prevtop = 0;
  local_68._target = 0;
  local_68._ncalls = 0;
  local_68._60_4_ = 0;
  local_68._root = 0;
  local_68._generator = (SQGenerator *)0x0;
  local_68._etraps = 0;
  local_68._prevstkbase = 0;
  local_68._ip = (SQInstruction *)0x0;
  local_68._literals = (SQObjectPtr *)0x0;
  local_68._closure.super_SQObject._type = OT_NULL;
  local_68._closure.super_SQObject._4_4_ = 0;
  sqvector<SQVM::CallInfo>::resize(&this->_callstackdata,4,&local_68);
  SQObjectPtr::~SQObjectPtr(&local_68._closure);
  this->_callsstacksize = 0;
  this->_callsstack = (this->_callstackdata)._vals;
  this->_top = 0;
  this->_stackbase = 0;
  if (friendvm == (SQVM *)0x0) {
    x = SQTable::Create(this->_sharedstate,0);
    SQObjectPtr::operator=(&this->_roottable,x);
    sq_base_register(this);
  }
  else {
    SQObjectPtr::operator=(&this->_roottable,&friendvm->_roottable);
    SQObjectPtr::operator=(&this->_errorhandler,&friendvm->_errorhandler);
    this->_debughook = friendvm->_debughook;
    this->_debughook_native = friendvm->_debughook_native;
    SQObjectPtr::operator=(&this->_debughook_closure,&friendvm->_debughook_closure);
  }
  return true;
}

Assistant:

bool SQVM::Init(SQVM *friendvm, SQInteger stacksize)
{
    _stack.resize(stacksize);
    _alloccallsstacksize = 4;
    _callstackdata.resize(_alloccallsstacksize);
    _callsstacksize = 0;
    _callsstack = &_callstackdata[0];
    _stackbase = 0;
    _top = 0;
    if(!friendvm) {
        _roottable = SQTable::Create(_ss(this), 0);
        sq_base_register(this);
    }
    else {
        _roottable = friendvm->_roottable;
        _errorhandler = friendvm->_errorhandler;
        _debughook = friendvm->_debughook;
        _debughook_native = friendvm->_debughook_native;
        _debughook_closure = friendvm->_debughook_closure;
    }


    return true;
}